

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O2

void __thiscall Map::Stand(Map *this,Character *from)

{
  Character *other;
  bool bVar1;
  _List_node_base *p_Var2;
  PacketBuilder builder;
  
  from->sitting = SIT_STAND;
  Character::CancelSpell(from);
  PacketBuilder::PacketBuilder(&builder,PACKET_SIT,PACKET_REMOVE,4);
  PacketBuilder::AddShort(&builder,(unsigned_short)from->player->id);
  PacketBuilder::AddChar(&builder,from->x);
  PacketBuilder::AddChar(&builder,from->y);
  p_Var2 = (_List_node_base *)&this->characters;
  while (p_Var2 = (((_List_base<Character_*,_std::allocator<Character_*>_> *)&p_Var2->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)&this->characters) {
    other = (Character *)p_Var2[1]._M_next;
    if (other != from) {
      bVar1 = Character::InRange(from,other);
      if (bVar1) {
        Character::Send(other,&builder);
      }
    }
  }
  PacketBuilder::~PacketBuilder(&builder);
  return;
}

Assistant:

void Map::Stand(Character *from)
{
	from->sitting = SIT_STAND;

	from->CancelSpell();

	PacketBuilder builder(PACKET_SIT, PACKET_REMOVE, 4);
	builder.AddShort(from->PlayerID());
	builder.AddChar(from->x);
	builder.AddChar(from->y);

	UTIL_FOREACH(this->characters, character)
	{
		if (character == from || !from->InRange(character))
		{
			continue;
		}

		character->Send(builder);
	}
}